

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCompoundCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall cbtCompoundLeafCallback::Process(cbtCompoundLeafCallback *this,cbtDbvtNode *leaf)

{
  ProcessChildShape(this,*(cbtCollisionShape **)
                          ((long)this->m_compoundColObjWrap->m_shape[1].m_userPointer +
                          (long)(leaf->field_2).dataAsInt * 0x58 + 0x40),(leaf->field_2).dataAsInt);
  return;
}

Assistant:

void Process(const cbtDbvtNode* leaf)
	{
		int index = leaf->dataAsInt;

		const cbtCompoundShape* compoundShape = static_cast<const cbtCompoundShape*>(m_compoundColObjWrap->getCollisionShape());
		const cbtCollisionShape* childShape = compoundShape->getChildShape(index);

#if 0
		if (m_dispatchInfo.m_debugDraw && (m_dispatchInfo.m_debugDraw->getDebugMode() & cbtIDebugDraw::DBG_DrawAabb))
		{
			cbtVector3 worldAabbMin,worldAabbMax;
			cbtTransform	orgTrans = m_compoundColObjWrap->getWorldTransform();
			cbtTransformAabb(leaf->volume.Mins(),leaf->volume.Maxs(),0.,orgTrans,worldAabbMin,worldAabbMax);
			m_dispatchInfo.m_debugDraw->drawAabb(worldAabbMin,worldAabbMax,cbtVector3(1,0,0));
		}
#endif

		ProcessChildShape(childShape, index);
	}